

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.h
# Opt level: O3

void __thiscall chain_of_responsibility::FirstWorker::~FirstWorker(FirstWorker *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR___cxa_pure_virtual_00129a78;
  pcVar2 = (this->super_IWorker).name_._M_dataplus._M_p;
  paVar1 = &(this->super_IWorker).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->super_IWorker).next_worker_.
            super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

IWorker::~IWorker() {}